

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall
plot::BrailleCanvas::ellipse(BrailleCanvas *this,Color *color,Rect rct,TerminalOp op)

{
  Rect rct_00;
  Rect rct_01;
  Rect rct_02;
  Rect rct_03;
  BrailleCanvas *pBVar1;
  anon_class_32_4_b873ab05 local_1f0;
  GenericPoint<long> local_1d0;
  GenericRect<long> local_1c0;
  anon_class_32_4_b873ab04 local_1a0;
  GenericPoint<long> local_180;
  GenericPoint<long> local_170;
  GenericRect<long> local_160;
  anon_class_32_4_b873ab05 local_140;
  GenericPoint<long> local_120;
  GenericPoint<long> local_110;
  GenericRect<long> local_100;
  anon_class_32_4_b873ab04 local_e0;
  GenericPoint<long> local_c0;
  GenericRect<long> local_b0;
  long local_90;
  Coord cy;
  Coord cx;
  Coord y_fac;
  undefined1 local_70 [4];
  float x_fac;
  GenericPoint<long> local_60;
  undefined1 local_50 [8];
  GenericPoint<long> size_;
  long local_38;
  long local_30;
  long local_28;
  TerminalOp op_local;
  Color *color_local;
  BrailleCanvas *this_local;
  
  GenericRect<long>::sorted((GenericRect<long> *)&size_.y,&rct);
  rct.p1.x = size_.y;
  rct.p1.y = local_38;
  rct.p2.x = local_30;
  rct.p2.y = local_28;
  local_60 = GenericRect<long>::size(&rct);
  GenericPoint<long>::GenericPoint((GenericPoint<long> *)local_70,1,1);
  _local_50 = operator+(&local_60,(GenericPoint<long> *)local_70);
  y_fac._4_4_ = 2.0 / (float)(long)local_50;
  cx = size_.x / 2 - (ulong)((size_.x % 2 != 0 ^ 0xffU) & 1);
  cy = (rct.p1.x + (long)local_50 / 2) - (ulong)(((long)local_50 % 2 != 0 ^ 0xffU) & 1);
  local_90 = rct.p1.y + cx;
  pBVar1 = push(this);
  GenericPoint<long>::GenericPoint(&local_c0,cy,local_90);
  GenericRect<long>::GenericRect(&local_b0,&rct.p1,&local_c0);
  local_e0.x_fac = y_fac._4_4_;
  local_e0.y_fac = cx;
  local_e0.cy = local_90;
  local_e0.x0 = rct.p1.x;
  rct_00.p1.y = local_b0.p1.y;
  rct_00.p1.x = local_b0.p1.x;
  rct_00.p2.x = local_b0.p2.x;
  rct_00.p2.y = local_b0.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_1_>
                     (pBVar1,color,rct_00,&local_e0,Over);
  GenericPoint<long>::GenericPoint(&local_110,cy + 1,rct.p1.y);
  GenericPoint<long>::GenericPoint(&local_120,rct.p2.x,local_90);
  GenericRect<long>::GenericRect(&local_100,&local_110,&local_120);
  local_140.x_fac = y_fac._4_4_;
  local_140.y_fac = cx;
  local_140.cy = local_90;
  local_140.x1 = rct.p2.x;
  rct_01.p1.y = local_100.p1.y;
  rct_01.p1.x = local_100.p1.x;
  rct_01.p2.x = local_100.p2.x;
  rct_01.p2.y = local_100.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_2_>
                     (pBVar1,color,rct_01,&local_140,Over);
  GenericPoint<long>::GenericPoint(&local_170,rct.p1.x,local_90 + 1);
  GenericPoint<long>::GenericPoint(&local_180,cy,rct.p2.y);
  GenericRect<long>::GenericRect(&local_160,&local_170,&local_180);
  local_1a0.x_fac = y_fac._4_4_;
  local_1a0.y_fac = cx;
  local_1a0.cy = local_90;
  local_1a0.x0 = rct.p1.x;
  rct_02.p1.y = local_160.p1.y;
  rct_02.p1.x = local_160.p1.x;
  rct_02.p2.x = local_160.p2.x;
  rct_02.p2.y = local_160.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_3_>
                     (pBVar1,color,rct_02,&local_1a0,Over);
  GenericPoint<long>::GenericPoint(&local_1d0,cy + 1,local_90 + 1);
  GenericRect<long>::GenericRect(&local_1c0,&local_1d0,&rct.p2);
  local_1f0.x_fac = y_fac._4_4_;
  local_1f0.y_fac = cx;
  local_1f0.cy = local_90;
  local_1f0.x1 = rct.p2.x;
  rct_03.p1.y = local_1c0.p1.y;
  rct_03.p1.x = local_1c0.p1.x;
  rct_03.p2.x = local_1c0.p2.x;
  rct_03.p2.y = local_1c0.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_4_>
                     (pBVar1,color,rct_03,&local_1f0,Over);
  pBVar1 = pop(pBVar1,op);
  return pBVar1;
}

Assistant:

BrailleCanvas& ellipse(Color const& color, Rect rct, TerminalOp op = TerminalOp::Over) {
        rct = rct.sorted();
        auto size_ = rct.size() + Point(1, 1);

        float x_fac = 2.0f/size_.x;
        Coord y_fac = size_.y/2 - (!(size_.y % 2)),
              cx = rct.p1.x + (size_.x/cell_cols) - (!(size_.x % cell_cols)),
              cy = rct.p1.y + y_fac;

        return push()
              .stroke(color, { rct.p1, { cx, cy } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { cx + 1, rct.p1.y }, { rct.p2.x, cy } }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((x1 - x + 1) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { rct.p1.x, cy + 1 }, { cx, rct.p2.y } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { cx + 1, cy + 1 }, rct.p2 }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x1 - x) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .pop(op);
    }